

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

int act_lookup(char *name)

{
  bool bVar1;
  char *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  int act;
  int local_20;
  int local_18;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if (act_flags[local_14].name == (char *)0x0) {
      return -1;
    }
    if ((*in_RDI < 'A') || ('Z' < *in_RDI)) {
      local_18 = (int)*in_RDI;
    }
    else {
      local_18 = *in_RDI + 0x20;
    }
    if ((*act_flags[local_14].name < 'A') || ('Z' < *act_flags[local_14].name)) {
      local_20 = (int)*act_flags[local_14].name;
    }
    else {
      local_20 = *act_flags[local_14].name + 0x20;
    }
    if ((local_18 == local_20) && (bVar1 = str_prefix(in_stack_00000008,unaff_retaddr), !bVar1))
    break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int act_lookup(const char *name)
{
	int act;

	// TODO: change act_flags from array to vector. requires detailed refactoring.
	for (act = 0; act_flags[act].name != nullptr; act++)
	{
		if (LOWER(name[0]) == LOWER(act_flags[act].name[0]) && !str_prefix(name, act_flags[act].name))
			return act;
	}

	return -1;
}